

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall Compiler::~Compiler(Compiler *this)

{
  Lexer *this_00;
  Parser *this_01;
  Compiler *this_local;
  
  this_00 = this->lexer;
  if (this_00 != (Lexer *)0x0) {
    Lexer::~Lexer(this_00);
    operator_delete(this_00,0x60);
  }
  this_01 = this->parser;
  if (this_01 != (Parser *)0x0) {
    Syntax::Parser::~Parser(this_01);
    operator_delete(this_01,0x20);
  }
  if (this->symTabGenerator != (STGV *)0x0) {
    (*(this->symTabGenerator->super_Visitor)._vptr_Visitor[0x1d])();
  }
  if (this->typeChecker != (TCV *)0x0) {
    (*(this->typeChecker->super_Visitor)._vptr_Visitor[0x1d])();
  }
  std::__cxx11::string::~string((string *)&this->filePath);
  return;
}

Assistant:

Compiler::~Compiler() {
    delete lexer;
    delete parser;
    delete symTabGenerator;
    delete typeChecker;
}